

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfoMB * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  PrimRefMB *pPVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  undefined1 auVar10 [16];
  int iVar11;
  undefined1 auVar12 [16];
  int iVar13;
  uint uVar14;
  undefined8 uVar15;
  int iVar16;
  long lVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  undefined4 uVar22;
  int iVar23;
  size_t *psVar24;
  long lVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar33;
  undefined1 auVar32 [16];
  float fVar34;
  float fVar39;
  float fVar40;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar41;
  undefined1 auVar42 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar43 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar49 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  ulong local_218;
  size_t local_1f0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  ulong local_130;
  anon_class_16_2_07cfa4d6 local_128;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar20 = r->_begin;
  auVar47 = ZEXT464(0x3f800000);
  auVar43 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_1c8._8_4_ = 0x7f800000;
  local_1c8._0_8_ = 0x7f8000007f800000;
  local_1c8._12_4_ = 0x7f800000;
  auVar53 = ZEXT1664(local_1c8);
  local_1a8._8_4_ = 0xff800000;
  local_1a8._0_8_ = 0xff800000ff800000;
  local_1a8._12_4_ = 0xff800000;
  auVar49 = ZEXT1664(local_1a8);
  local_218 = 0;
  auVar54 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar55 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
  auVar56 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
  local_1b8 = ZEXT816(0);
  local_1f0 = k;
  local_198 = local_1c8;
  local_188 = local_1a8;
  while( true ) {
    auVar38 = auVar47._0_16_;
    if (r->_end <= uVar20) {
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        lower.field_0 = local_1c8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.lower.field_0 + 8) = local_1c8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        upper.field_0 = local_1a8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.upper.field_0 + 8) = local_1a8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        lower.field_0 = local_198._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.lower.field_0 + 8) = local_198._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        upper.field_0 = local_188._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.upper.field_0 + 8) = local_188._8_8_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar53._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar49._0_16_;
      (__return_storage_ptr__->object_range)._end = local_1b8._0_8_;
      __return_storage_ptr__->num_time_segments = local_1b8._8_8_;
      __return_storage_ptr__->max_num_time_segments = local_218;
      auVar38 = vmovlhps_avx(auVar43._0_16_,auVar38);
      (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar38._0_8_;
      (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar38._0_8_ >> 0x20);
      (__return_storage_ptr__->time_range).lower = (float)(int)auVar38._8_8_;
      (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar38._8_8_ >> 0x20);
      return __return_storage_ptr__;
    }
    BVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    auVar29._8_8_ = 0;
    auVar29._0_4_ = BVar2.lower;
    auVar29._4_4_ = BVar2.upper;
    auVar29 = vmovshdup_avx(auVar29);
    fVar26 = BVar2.lower;
    fVar27 = auVar29._0_4_ - fVar26;
    uVar14 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.super_Geometry.field_0x58 +
                      *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                super_CurveGeometry.field_0x68 * uVar20);
    pBVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             vertices.items;
    if ((ulong)(uVar14 + 3) < (pBVar3->super_RawBufferView).num) break;
LAB_00bdd173:
    uVar20 = uVar20 + 1;
  }
  fVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.fnumTimeSegments;
  auVar29 = ZEXT416((uint)(fVar1 * ((t0t1->upper - fVar26) / fVar27) * 0.99999976));
  auVar29 = vroundss_avx(auVar29,auVar29,10);
  auVar30 = vminss_avx(auVar29,ZEXT416((uint)fVar1));
  fVar34 = (t0t1->lower - fVar26) / fVar27;
  auVar29 = ZEXT416((uint)(fVar1 * fVar34 * 1.0000002));
  auVar29 = vroundss_avx(auVar29,auVar29,9);
  auVar29 = vmaxss_avx(auVar54._0_16_,auVar29);
  psVar24 = &pBVar3[(int)auVar29._0_4_].super_RawBufferView.stride;
  uVar19 = (long)(int)auVar29._0_4_ - 1;
  uVar15 = 0xffffffffffffffff;
LAB_00bdd054:
  uVar19 = uVar19 + 1;
  if ((ulong)(long)(int)auVar30._0_4_ < uVar19) {
    local_128.primID = &local_130;
    fVar27 = (t0t1->upper - fVar26) / fVar27;
    fVar26 = fVar1 * fVar34;
    fVar33 = fVar1 * fVar27;
    auVar32 = vroundss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26),9);
    auVar36 = vroundss_avx(ZEXT416((uint)fVar33),ZEXT416((uint)fVar33),10);
    auVar29 = vmaxss_avx(auVar32,auVar54._0_16_);
    auVar30 = vminss_avx(auVar36,ZEXT416((uint)fVar1));
    iVar23 = (int)auVar29._0_4_;
    fVar31 = auVar30._0_4_;
    iVar13 = (int)auVar32._0_4_;
    iVar16 = -1;
    if (-1 < iVar13) {
      iVar16 = iVar13;
    }
    iVar11 = (int)fVar1 + 1;
    if ((int)auVar36._0_4_ < (int)fVar1 + 1) {
      iVar11 = (int)auVar36._0_4_;
    }
    local_130 = uVar20;
    local_128.this = this;
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_128,(long)iVar23);
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_128,(long)(int)fVar31);
    fVar26 = fVar26 - auVar29._0_4_;
    if (iVar11 - iVar16 == 1) {
      auVar29 = vmaxss_avx(ZEXT416((uint)fVar26),ZEXT816(0) << 0x40);
      auVar30 = vshufps_avx(auVar29,auVar29,0);
      auVar29 = ZEXT416((uint)(1.0 - auVar29._0_4_));
      auVar29 = vshufps_avx(auVar29,auVar29,0);
      auVar48._0_4_ =
           auVar30._0_4_ * bupper1.lower.field_0.m128[0] +
           auVar29._0_4_ * blower0.lower.field_0.m128[0];
      auVar48._4_4_ =
           auVar30._4_4_ * bupper1.lower.field_0.m128[1] +
           auVar29._4_4_ * blower0.lower.field_0.m128[1];
      auVar48._8_4_ =
           auVar30._8_4_ * bupper1.lower.field_0.m128[2] +
           auVar29._8_4_ * blower0.lower.field_0.m128[2];
      auVar48._12_4_ =
           auVar30._12_4_ * bupper1.lower.field_0.m128[3] +
           auVar29._12_4_ * blower0.lower.field_0.m128[3];
      auVar42._0_4_ =
           auVar30._0_4_ * bupper1.upper.field_0.m128[0] +
           auVar29._0_4_ * blower0.upper.field_0.m128[0];
      auVar42._4_4_ =
           auVar30._4_4_ * bupper1.upper.field_0.m128[1] +
           auVar29._4_4_ * blower0.upper.field_0.m128[1];
      auVar42._8_4_ =
           auVar30._8_4_ * bupper1.upper.field_0.m128[2] +
           auVar29._8_4_ * blower0.upper.field_0.m128[2];
      auVar42._12_4_ =
           auVar30._12_4_ * bupper1.upper.field_0.m128[3] +
           auVar29._12_4_ * blower0.upper.field_0.m128[3];
      auVar29 = vmaxss_avx(ZEXT416((uint)(fVar31 - fVar33)),ZEXT816(0) << 0x40);
      auVar30 = vshufps_avx(auVar29,auVar29,0);
      auVar29 = ZEXT416((uint)(1.0 - auVar29._0_4_));
      auVar29 = vshufps_avx(auVar29,auVar29,0);
      auVar32._0_4_ =
           auVar29._0_4_ * bupper1.lower.field_0.m128[0] +
           auVar30._0_4_ * blower0.lower.field_0.m128[0];
      auVar32._4_4_ =
           auVar29._4_4_ * bupper1.lower.field_0.m128[1] +
           auVar30._4_4_ * blower0.lower.field_0.m128[1];
      auVar32._8_4_ =
           auVar29._8_4_ * bupper1.lower.field_0.m128[2] +
           auVar30._8_4_ * blower0.lower.field_0.m128[2];
      auVar32._12_4_ =
           auVar29._12_4_ * bupper1.lower.field_0.m128[3] +
           auVar30._12_4_ * blower0.lower.field_0.m128[3];
      auVar36._0_4_ =
           auVar29._0_4_ * bupper1.upper.field_0.m128[0] +
           auVar30._0_4_ * blower0.upper.field_0.m128[0];
      auVar36._4_4_ =
           auVar29._4_4_ * bupper1.upper.field_0.m128[1] +
           auVar30._4_4_ * blower0.upper.field_0.m128[1];
      auVar36._8_4_ =
           auVar29._8_4_ * bupper1.upper.field_0.m128[2] +
           auVar30._8_4_ * blower0.upper.field_0.m128[2];
      auVar36._12_4_ =
           auVar29._12_4_ * bupper1.upper.field_0.m128[3] +
           auVar30._12_4_ * blower0.upper.field_0.m128[3];
    }
    else {
      linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower1,&local_128,(long)(iVar23 + 1));
      linearBounds::anon_class_16_2_07cfa4d6::operator()
                (&bupper0,&local_128,(long)((int)fVar31 + -1));
      auVar29 = vmaxss_avx(ZEXT416((uint)fVar26),ZEXT816(0) << 0x40);
      auVar30 = vshufps_avx(auVar29,auVar29,0);
      auVar29 = ZEXT416((uint)(1.0 - auVar29._0_4_));
      auVar29 = vshufps_avx(auVar29,auVar29,0);
      auVar48._0_4_ =
           auVar30._0_4_ * blower1.lower.field_0.m128[0] +
           auVar29._0_4_ * blower0.lower.field_0.m128[0];
      auVar48._4_4_ =
           auVar30._4_4_ * blower1.lower.field_0.m128[1] +
           auVar29._4_4_ * blower0.lower.field_0.m128[1];
      auVar48._8_4_ =
           auVar30._8_4_ * blower1.lower.field_0.m128[2] +
           auVar29._8_4_ * blower0.lower.field_0.m128[2];
      auVar48._12_4_ =
           auVar30._12_4_ * blower1.lower.field_0.m128[3] +
           auVar29._12_4_ * blower0.lower.field_0.m128[3];
      auVar42._0_4_ =
           auVar30._0_4_ * blower1.upper.field_0.m128[0] +
           auVar29._0_4_ * blower0.upper.field_0.m128[0];
      auVar42._4_4_ =
           auVar30._4_4_ * blower1.upper.field_0.m128[1] +
           auVar29._4_4_ * blower0.upper.field_0.m128[1];
      auVar42._8_4_ =
           auVar30._8_4_ * blower1.upper.field_0.m128[2] +
           auVar29._8_4_ * blower0.upper.field_0.m128[2];
      auVar42._12_4_ =
           auVar30._12_4_ * blower1.upper.field_0.m128[3] +
           auVar29._12_4_ * blower0.upper.field_0.m128[3];
      auVar29 = vmaxss_avx(ZEXT416((uint)(fVar31 - fVar33)),ZEXT816(0) << 0x40);
      auVar30 = vshufps_avx(auVar29,auVar29,0);
      auVar29 = ZEXT416((uint)(1.0 - auVar29._0_4_));
      auVar29 = vshufps_avx(auVar29,auVar29,0);
      auVar32._0_4_ =
           auVar30._0_4_ * bupper0.lower.field_0.m128[0] +
           auVar29._0_4_ * bupper1.lower.field_0.m128[0];
      auVar32._4_4_ =
           auVar30._4_4_ * bupper0.lower.field_0.m128[1] +
           auVar29._4_4_ * bupper1.lower.field_0.m128[1];
      auVar32._8_4_ =
           auVar30._8_4_ * bupper0.lower.field_0.m128[2] +
           auVar29._8_4_ * bupper1.lower.field_0.m128[2];
      auVar32._12_4_ =
           auVar30._12_4_ * bupper0.lower.field_0.m128[3] +
           auVar29._12_4_ * bupper1.lower.field_0.m128[3];
      auVar36._0_4_ =
           auVar30._0_4_ * bupper0.upper.field_0.m128[0] +
           auVar29._0_4_ * bupper1.upper.field_0.m128[0];
      auVar36._4_4_ =
           auVar30._4_4_ * bupper0.upper.field_0.m128[1] +
           auVar29._4_4_ * bupper1.upper.field_0.m128[1];
      auVar36._8_4_ =
           auVar30._8_4_ * bupper0.upper.field_0.m128[2] +
           auVar29._8_4_ * bupper1.upper.field_0.m128[2];
      auVar36._12_4_ =
           auVar30._12_4_ * bupper0.upper.field_0.m128[3] +
           auVar29._12_4_ * bupper1.upper.field_0.m128[3];
      uVar15 = 0xffffffffffffffff;
      if (iVar13 < 0) {
        iVar13 = -1;
      }
      sVar18 = (size_t)iVar13;
      while (sVar18 = sVar18 + 1, (long)sVar18 < (long)iVar11) {
        auVar30._0_4_ = ((float)(int)sVar18 / fVar1 - fVar34) / (fVar27 - fVar34);
        auVar30._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar29 = vshufps_avx(auVar30,auVar30,0);
        fVar26 = auVar32._4_4_;
        fVar33 = auVar32._8_4_;
        fVar31 = auVar32._12_4_;
        auVar30 = vshufps_avx(ZEXT416((uint)(1.0 - auVar30._0_4_)),
                              ZEXT416((uint)(1.0 - auVar30._0_4_)),0);
        fVar50 = auVar48._4_4_;
        fVar51 = auVar48._8_4_;
        fVar52 = auVar48._12_4_;
        fVar39 = auVar36._4_4_;
        fVar40 = auVar36._8_4_;
        fVar41 = auVar36._12_4_;
        fVar44 = auVar42._4_4_;
        fVar45 = auVar42._8_4_;
        fVar46 = auVar42._12_4_;
        linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_128,sVar18);
        auVar10._4_4_ = fVar26 * auVar29._4_4_ + fVar50 * auVar30._4_4_;
        auVar10._0_4_ = auVar32._0_4_ * auVar29._0_4_ + auVar48._0_4_ * auVar30._0_4_;
        auVar10._8_4_ = fVar33 * auVar29._8_4_ + fVar51 * auVar30._8_4_;
        auVar10._12_4_ = fVar31 * auVar29._12_4_ + fVar52 * auVar30._12_4_;
        auVar10 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar10);
        auVar12._4_4_ = fVar39 * auVar29._4_4_ + fVar44 * auVar30._4_4_;
        auVar12._0_4_ = auVar36._0_4_ * auVar29._0_4_ + auVar42._0_4_ * auVar30._0_4_;
        auVar12._8_4_ = fVar40 * auVar29._8_4_ + fVar45 * auVar30._8_4_;
        auVar12._12_4_ = fVar41 * auVar29._12_4_ + fVar46 * auVar30._12_4_;
        auVar29 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar12);
        auVar30 = vminps_avx(auVar10,ZEXT816(0) << 0x40);
        auVar29 = vmaxps_avx(auVar29,ZEXT816(0) << 0x40);
        auVar48._0_4_ = auVar48._0_4_ + auVar30._0_4_;
        auVar48._4_4_ = fVar50 + auVar30._4_4_;
        auVar48._8_4_ = fVar51 + auVar30._8_4_;
        auVar48._12_4_ = fVar52 + auVar30._12_4_;
        auVar32._0_4_ = auVar32._0_4_ + auVar30._0_4_;
        auVar32._4_4_ = fVar26 + auVar30._4_4_;
        auVar32._8_4_ = fVar33 + auVar30._8_4_;
        auVar32._12_4_ = fVar31 + auVar30._12_4_;
        auVar42._0_4_ = auVar42._0_4_ + auVar29._0_4_;
        auVar42._4_4_ = fVar44 + auVar29._4_4_;
        auVar42._8_4_ = fVar45 + auVar29._8_4_;
        auVar42._12_4_ = fVar46 + auVar29._12_4_;
        auVar36._0_4_ = auVar36._0_4_ + auVar29._0_4_;
        auVar36._4_4_ = fVar39 + auVar29._4_4_;
        auVar36._8_4_ = fVar40 + auVar29._8_4_;
        auVar36._12_4_ = fVar41 + auVar29._12_4_;
      }
    }
    auVar54 = ZEXT1664(ZEXT816(0) << 0x40);
    aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar48,ZEXT416(geomID),0x30);
    uVar14 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             super_Geometry.numTimeSteps - 1;
    uVar19 = (ulong)uVar14;
    BVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    auVar28._8_8_ = 0;
    auVar28._0_4_ = BVar2.lower;
    auVar28._4_4_ = BVar2.upper;
    aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar42,ZEXT416((uint)uVar20),0x30);
    aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar32,ZEXT416(uVar14),0x30);
    aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
            vinsertps_avx(auVar36,ZEXT416(uVar14),0x30);
    auVar29 = vcmpps_avx(auVar38,auVar28,1);
    auVar30 = vinsertps_avx(auVar38,auVar28,0x50);
    auVar38 = vblendps_avx(auVar28,auVar38,2);
    auVar38 = vblendvps_avx(auVar38,auVar30,auVar29);
    auVar47 = ZEXT1664(auVar38);
    auVar37._0_4_ = aVar6.x * 0.5 + aVar8.x * 0.5 + aVar7.x * 0.5 + aVar9.x * 0.5;
    auVar37._4_4_ = aVar6.y * 0.5 + aVar8.y * 0.5 + aVar7.y * 0.5 + aVar9.y * 0.5;
    auVar37._8_4_ = aVar6.z * 0.5 + aVar8.z * 0.5 + aVar7.z * 0.5 + aVar9.z * 0.5;
    auVar37._12_4_ =
         aVar6.field_3.w * 0.5 + aVar8.field_3.w * 0.5 +
         aVar7.field_3.w * 0.5 + aVar9.field_3.w * 0.5;
    auVar38 = vminps_avx((undefined1  [16])auVar53._0_16_,auVar37);
    auVar53 = ZEXT1664(auVar38);
    auVar38 = vmaxps_avx((undefined1  [16])auVar49._0_16_,auVar37);
    auVar49 = ZEXT1664(auVar38);
    auVar38 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)((ulong)uVar15 >> 8),local_218 < uVar19)),
                          0x50);
    auVar38 = vpslld_avx(auVar38,0x1f);
    auVar38 = vblendvps_avx(auVar43._0_16_,auVar28,auVar38);
    auVar43 = ZEXT1664(auVar38);
    auVar38 = vpmovsxbq_avx(ZEXT216(0x101));
    auVar38 = vpinsrq_avx(auVar38,uVar19,1);
    local_1b8 = vpaddq_avx(local_1b8,auVar38);
    if (local_218 <= uVar19) {
      local_218 = uVar19;
    }
    local_1c8 = vminps_avx(local_1c8,(undefined1  [16])aVar6);
    pPVar5 = prims->items;
    pPVar5[local_1f0].lbounds.bounds0.lower.field_0.field_1 = aVar6;
    local_1a8 = vmaxps_avx(local_1a8,(undefined1  [16])aVar7);
    pPVar5[local_1f0].lbounds.bounds0.upper.field_0.field_1 = aVar7;
    local_198 = vminps_avx(local_198,(undefined1  [16])aVar8);
    pPVar5[local_1f0].lbounds.bounds1.lower.field_0.field_1 = aVar8;
    local_188 = vmaxps_avx(local_188,(undefined1  [16])aVar9);
    pPVar5[local_1f0].lbounds.bounds1.upper.field_0.field_1 = aVar9;
    pPVar5[local_1f0].time_range = BVar2;
    local_1f0 = local_1f0 + 1;
    auVar55 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    auVar56 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
  }
  else {
    pcVar4 = ((RawBufferView *)(psVar24 + -2))->ptr_ofs;
    sVar18 = *psVar24;
    lVar25 = sVar18 * (uVar14 + 1);
    lVar17 = sVar18 * (uVar14 + 2);
    lVar21 = sVar18 * (uVar14 + 3);
    auVar29 = vinsertps_avx(ZEXT416(*(uint *)(pcVar4 + sVar18 * uVar14 + 0xc)),
                            ZEXT416(*(uint *)(pcVar4 + lVar25 + 0xc)),0x10);
    auVar29 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(pcVar4 + lVar17 + 0xc)),0x20);
    auVar29 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(pcVar4 + lVar21 + 0xc)),0x30);
    auVar29 = vandps_avx(auVar55._0_16_,auVar29);
    auVar32 = auVar56._0_16_;
    auVar29 = vcmpps_avx(auVar29,auVar32,5);
    if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar29 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar29 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar29[0xf]) {
      auVar35._8_4_ = 0xddccb9a2;
      auVar35._0_8_ = 0xddccb9a2ddccb9a2;
      auVar35._12_4_ = 0xddccb9a2;
      auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + sVar18 * uVar14),auVar35,6);
      auVar36 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + sVar18 * uVar14),auVar32,1);
      auVar29 = vandps_avx(auVar29,auVar36);
      uVar22 = vmovmskps_avx(auVar29);
      if ((~(byte)uVar22 & 7) == 0) {
        auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + lVar25),auVar35,6);
        auVar36 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + lVar25),auVar32,1);
        auVar29 = vandps_avx(auVar29,auVar36);
        uVar22 = vmovmskps_avx(auVar29);
        if ((~(byte)uVar22 & 7) == 0) {
          auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + lVar17),auVar35,6);
          auVar36 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + lVar17),auVar32,1);
          auVar29 = vandps_avx(auVar29,auVar36);
          uVar22 = vmovmskps_avx(auVar29);
          if ((~(byte)uVar22 & 7) == 0) goto code_r0x00bdd131;
        }
      }
    }
  }
  goto LAB_00bdd173;
code_r0x00bdd131:
  psVar24 = psVar24 + 7;
  auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + lVar21),auVar35,6);
  auVar32 = vcmpps_avx(*(undefined1 (*) [16])(pcVar4 + lVar21),auVar32,1);
  auVar29 = vandps_avx(auVar29,auVar32);
  uVar22 = vmovmskps_avx(auVar29);
  if ((~(byte)uVar22 & 7) != 0) goto LAB_00bdd173;
  goto LAB_00bdd054;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }